

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_start_doc(Parser *this,bool as_child)

{
  undefined1 uVar1;
  ulong uVar2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  NodeData *pNVar10;
  size_t *psVar11;
  Tree *pTVar12;
  NodeData *pNVar13;
  size_t ichild;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  Tree *pTVar17;
  char *pcVar18;
  ulong iprev_sibling;
  byte bVar19;
  char msg [58];
  char local_128 [24];
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined2 local_108;
  undefined1 uStack_106;
  undefined5 uStack_105;
  undefined2 uStack_100;
  undefined1 uStack_fe;
  undefined5 uStack_fd;
  undefined2 uStack_f8;
  char acStack_f6 [22];
  undefined4 local_e0;
  undefined1 local_dc;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  bVar19 = 0;
  if ((this->m_stack).m_size == 0) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = '_';
    local_128[9] = '\\';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    uStack_110 = 0x1f7eca;
    uStack_10c = 0;
    local_108 = 0x65;
    uStack_106 = 0;
    uStack_105 = 0;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  pTVar17 = this->m_tree;
  uVar2 = ((this->m_stack).m_stack)->node_id;
  if (uVar2 == 0xffffffffffffffff) {
    pNVar13 = (NodeData *)0x0;
  }
  else {
    pTVar12 = pTVar17;
    if (pTVar17->m_cap <= uVar2) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      uStack_110 = 0x1f7eca;
      uStack_10c = 0;
      local_108 = 0x65;
      uStack_106 = 0;
      uStack_105 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
      pTVar12 = this->m_tree;
    }
    pNVar13 = pTVar17->m_buf + uVar2;
    pTVar17 = pTVar12;
  }
  uVar2 = this->m_root_id;
  if (uVar2 == 0xffffffffffffffff) {
    pNVar10 = (NodeData *)0x0;
  }
  else {
    if (pTVar17->m_cap <= uVar2) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      uStack_110 = 0x1f7eca;
      uStack_10c = 0;
      local_108 = 0x65;
      uStack_106 = 0;
      uStack_105 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    pNVar10 = pTVar17->m_buf + uVar2;
  }
  if (pNVar13 != pNVar10) {
    uStack_f8 = 0x6f72;
    builtin_strncpy(acStack_f6,"ot_id))",8);
    local_108 = 0x6d6f;
    uStack_106 = 0x28;
    uStack_105 = 0x3d3d202929;
    uStack_100 = 0x6e20;
    uStack_fe = 0x6f;
    uStack_fd = 0x5f6d286564;
    builtin_strncpy(local_128 + 0x10,"ode(m_st",8);
    uStack_110 = 0x2e6b6361;
    uStack_10c = 0x74746f62;
    builtin_strncpy(local_128,"check failed: (n",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_58 = 0;
    uStack_50 = 0x775e;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x775e) << 0x40);
    LVar4.name.str._0_4_ = 0x1f7eca;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = 0;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_128,0x3a,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar2 = (this->m_stack).m_size;
  psVar11 = &(this->m_stack).m_stack[uVar2 - 2].node_id;
  if (uVar2 < 2) {
    psVar11 = &this->m_root_id;
  }
  uVar2 = *psVar11;
  if (uVar2 == 0xffffffffffffffff) {
    builtin_strncpy(local_128 + 0x10,"arent_id",8);
    uStack_110 = 0x203d2120;
    uStack_10c = 0x454e4f4e;
    builtin_strncpy(local_128,"check failed: (p",0x10);
    local_108 = 0x29;
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_80 = 0;
    uStack_78 = 0x7760;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x7760) << 0x40);
    LVar6.name.str._0_4_ = 0x1f7eca;
    LVar6.super_LineCol.offset = auVar5._0_8_;
    LVar6.super_LineCol.line = auVar5._8_8_;
    LVar6.super_LineCol.col = auVar5._16_8_;
    LVar6.name.str._4_4_ = 0;
    LVar6.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_128,0x22,LVar6,(this->m_stack).m_callbacks.m_user_data);
    pTVar17 = this->m_tree;
    uVar15 = 0xffffffffffffffff;
  }
  else {
    pTVar17 = this->m_tree;
    uVar15 = uVar2;
  }
  bVar9 = Tree::is_root(pTVar17,uVar15);
  if (!bVar9) {
    local_108 = 0x7261;
    uStack_106 = 0x65;
    uStack_105 = 0x64695f746e;
    uStack_100 = 0x2929;
    uStack_fe = 0;
    builtin_strncpy(local_128 + 0x10,"_tree->i",8);
    uStack_110 = 0x6f725f73;
    uStack_10c = 0x7028746f;
    builtin_strncpy(local_128,"check failed: (m",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_a8 = 0;
    uStack_a0 = 0x7761;
    local_98 = 0;
    pcStack_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_88 = 0x65;
    auVar5 = ZEXT1224(ZEXT412(0x7761) << 0x40);
    LVar7.name.str._0_4_ = 0x1f7eca;
    LVar7.super_LineCol.offset = auVar5._0_8_;
    LVar7.super_LineCol.line = auVar5._8_8_;
    LVar7.super_LineCol.col = auVar5._16_8_;
    LVar7.name.str._4_4_ = 0;
    LVar7.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_128,0x2b,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar15 = this->m_state->node_id;
  if (uVar15 != 0xffffffffffffffff) {
    pTVar17 = this->m_tree;
    if (pTVar17->m_cap <= uVar15) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = 't';
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      uStack_110 = 0x1f7eca;
      uStack_10c = 0;
      local_108 = 0x65;
      uStack_106 = 0;
      uStack_105 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i >= 0 && i < m_cap",0x21,(anonymous_namespace)::s_default_callbacks
                );
    }
    if (pTVar17->m_buf != (NodeData *)0x0) {
      pTVar17 = this->m_tree;
      uVar15 = this->m_state->node_id;
      if (uVar15 == 0xffffffffffffffff) {
        pNVar13 = (NodeData *)0x0;
      }
      else {
        pTVar12 = pTVar17;
        if (pTVar17->m_cap <= uVar15) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_128[0] = '\0';
          local_128[1] = '\0';
          local_128[2] = '\0';
          local_128[3] = '\0';
          local_128[4] = '\0';
          local_128[5] = '\0';
          local_128[6] = '\0';
          local_128[7] = '\0';
          local_128[8] = 't';
          local_128[9] = 'K';
          local_128[10] = '\0';
          local_128[0xb] = '\0';
          local_128[0xc] = '\0';
          local_128[0xd] = '\0';
          local_128[0xe] = '\0';
          local_128[0xf] = '\0';
          local_128[0x10] = '\0';
          local_128[0x11] = '\0';
          local_128[0x12] = '\0';
          local_128[0x13] = '\0';
          local_128[0x14] = '\0';
          local_128[0x15] = '\0';
          local_128[0x16] = '\0';
          local_128[0x17] = '\0';
          uStack_110 = 0x1f7eca;
          uStack_10c = 0;
          local_108 = 0x65;
          uStack_106 = 0;
          uStack_105 = 0;
          (*(code *)PTR_error_impl_002394c8)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
          pTVar12 = this->m_tree;
        }
        pNVar13 = pTVar17->m_buf + uVar15;
        pTVar17 = pTVar12;
      }
      uVar15 = this->m_root_id;
      if (uVar15 == 0xffffffffffffffff) {
        pNVar10 = (NodeData *)0x0;
      }
      else {
        if (pTVar17->m_cap <= uVar15) {
          if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_128[0] = '\0';
          local_128[1] = '\0';
          local_128[2] = '\0';
          local_128[3] = '\0';
          local_128[4] = '\0';
          local_128[5] = '\0';
          local_128[6] = '\0';
          local_128[7] = '\0';
          local_128[8] = 't';
          local_128[9] = 'K';
          local_128[10] = '\0';
          local_128[0xb] = '\0';
          local_128[0xc] = '\0';
          local_128[0xd] = '\0';
          local_128[0xe] = '\0';
          local_128[0xf] = '\0';
          local_128[0x10] = '\0';
          local_128[0x11] = '\0';
          local_128[0x12] = '\0';
          local_128[0x13] = '\0';
          local_128[0x14] = '\0';
          local_128[0x15] = '\0';
          local_128[0x16] = '\0';
          local_128[0x17] = '\0';
          uStack_110 = 0x1f7eca;
          uStack_10c = 0;
          local_108 = 0x65;
          uStack_106 = 0;
          uStack_105 = 0;
          (*(code *)PTR_error_impl_002394c8)
                    ("check failed: i >= 0 && i < m_cap",0x21,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar10 = pTVar17->m_buf + uVar15;
      }
      if (pNVar13 != pNVar10) {
        pcVar16 = "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))";
        pcVar18 = local_128;
        for (lVar14 = 9; lVar14 != 0; lVar14 = lVar14 + -1) {
          *(undefined8 *)pcVar18 = *(undefined8 *)pcVar16;
          pcVar16 = pcVar16 + ((ulong)bVar19 * -2 + 1) * 8;
          pcVar18 = pcVar18 + ((ulong)bVar19 * -2 + 1) * 8;
        }
        local_dc = 0;
        local_e0 = 0x29296469;
        if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_d0 = 0;
        uStack_c8 = 0x7762;
        local_c0 = 0;
        pcStack_b8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_b0 = 0x65;
        auVar5 = ZEXT1224(ZEXT412(0x7762) << 0x40);
        LVar8.name.str._0_4_ = 0x1f7eca;
        LVar8.super_LineCol.offset = auVar5._0_8_;
        LVar8.super_LineCol.line = auVar5._8_8_;
        LVar8.super_LineCol.col = auVar5._16_8_;
        LVar8.name.str._4_4_ = 0;
        LVar8.name.len = 0x65;
        (*(this->m_stack).m_callbacks.m_error)
                  (local_128,0x4d,LVar8,(this->m_stack).m_callbacks.m_user_data);
      }
    }
  }
  if (!as_child) goto LAB_001d0bd9;
  pTVar17 = this->m_tree;
  if ((uVar2 == 0xffffffffffffffff) || (pTVar12 = pTVar17, pTVar17->m_cap <= uVar2)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = -0x7a;
    local_128[9] = 'K';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    uStack_110 = 0x1f7eca;
    uStack_10c = 0;
    local_108 = 0x65;
    uStack_106 = 0;
    uStack_105 = 0;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pTVar12 = this->m_tree;
  }
  if ((~(int)pTVar17->m_buf[uVar2].m_type.type & 0x28U) != 0) {
    Tree::set_root_as_stream(pTVar12);
    pTVar12 = this->m_tree;
  }
  if ((uVar2 == 0xffffffffffffffff) || (uVar15 = pTVar12->m_cap, uVar15 <= uVar2)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = -0x7d;
    local_128[9] = 'K';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    uStack_110 = 0x1f7eca;
    uStack_10c = 0;
    local_108 = 0x65;
    uStack_106 = 0;
    uStack_105 = 0;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    pNVar13 = pTVar12->m_buf;
    iprev_sibling = pNVar13[uVar2].m_last_child;
    if (uVar2 != 0xffffffffffffffff) {
      uVar15 = pTVar12->m_cap;
      goto LAB_001d08a3;
    }
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = -0x4f;
    local_128[9] = 'L';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    uStack_110 = 0x1f7eca;
    uStack_10c = 0;
    local_108 = 0x65;
    uStack_106 = 0;
    uStack_105 = 0;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = -0x7a;
    local_128[9] = 'K';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    uStack_110 = 0x1f7eca;
    uStack_10c = 0;
    local_108 = 0x65;
    uStack_106 = 0;
    uStack_105 = 0;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
    uVar1 = (undefined1)pTVar12->m_buf[-1].m_type.type;
  }
  else {
    pNVar13 = pTVar12->m_buf;
    iprev_sibling = pNVar13[uVar2].m_last_child;
LAB_001d08a3:
    if (uVar15 <= uVar2) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7a;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      uStack_110 = 0x1f7eca;
      uStack_10c = 0;
      local_108 = 0x65;
      uStack_106 = 0;
      uStack_105 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      pNVar13 = pTVar12->m_buf;
    }
    uVar1 = (undefined1)pNVar13[uVar2].m_type.type;
  }
  if (((uVar1 & (STREAM|MAP)) == NOTYPE) && (bVar9 = Tree::is_root(pTVar12,uVar2), !bVar9)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_128[0] = '\0';
    local_128[1] = '\0';
    local_128[2] = '\0';
    local_128[3] = '\0';
    local_128[4] = '\0';
    local_128[5] = '\0';
    local_128[6] = '\0';
    local_128[7] = '\0';
    local_128[8] = -0x4e;
    local_128[9] = 'L';
    local_128[10] = '\0';
    local_128[0xb] = '\0';
    local_128[0xc] = '\0';
    local_128[0xd] = '\0';
    local_128[0xe] = '\0';
    local_128[0xf] = '\0';
    local_128[0x10] = '\0';
    local_128[0x11] = '\0';
    local_128[0x12] = '\0';
    local_128[0x13] = '\0';
    local_128[0x14] = '\0';
    local_128[0x15] = '\0';
    local_128[0x16] = '\0';
    local_128[0x17] = '\0';
    uStack_110 = 0x1f7eca;
    uStack_10c = 0;
    local_108 = 0x65;
    uStack_106 = 0;
    uStack_105 = 0;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: is_container(parent) || is_root(parent)",0x35,
               (anonymous_namespace)::s_default_callbacks);
  }
  if (iprev_sibling != 0xffffffffffffffff) {
    if (pTVar12->m_cap <= iprev_sibling) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x7d;
      local_128[9] = 'K';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      uStack_110 = 0x1f7eca;
      uStack_10c = 0;
      local_108 = 0x65;
      uStack_106 = 0;
      uStack_105 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if (pTVar12->m_buf[iprev_sibling].m_parent != uVar2) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_128[0] = '\0';
      local_128[1] = '\0';
      local_128[2] = '\0';
      local_128[3] = '\0';
      local_128[4] = '\0';
      local_128[5] = '\0';
      local_128[6] = '\0';
      local_128[7] = '\0';
      local_128[8] = -0x4d;
      local_128[9] = 'L';
      local_128[10] = '\0';
      local_128[0xb] = '\0';
      local_128[0xc] = '\0';
      local_128[0xd] = '\0';
      local_128[0xe] = '\0';
      local_128[0xf] = '\0';
      local_128[0x10] = '\0';
      local_128[0x11] = '\0';
      local_128[0x12] = '\0';
      local_128[0x13] = '\0';
      local_128[0x14] = '\0';
      local_128[0x15] = '\0';
      local_128[0x16] = '\0';
      local_128[0x17] = '\0';
      uStack_110 = 0x1f7eca;
      uStack_10c = 0;
      local_108 = 0x65;
      uStack_106 = 0;
      uStack_105 = 0;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                 (anonymous_namespace)::s_default_callbacks);
    }
  }
  ichild = Tree::_claim(pTVar12);
  Tree::_set_hierarchy(pTVar12,ichild,uVar2,iprev_sibling);
  this->m_state->node_id = ichild;
  Tree::to_doc(this->m_tree,ichild,0);
LAB_001d0bd9:
  this->m_state->flags = this->m_state->flags | 0x1003;
  _handle_types(this);
  this->m_state->flags = this->m_state->flags & 0xffffefff;
  return;
}

Assistant:

void Parser::_start_doc(bool as_child)
{
    _c4dbgpf("start_doc (as child={})", as_child);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_root(parent_id));
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        _c4dbgpf("start_doc: parent={}", parent_id);
        if( ! m_tree->is_stream(parent_id))
        {
            _c4dbgp("start_doc: rearranging with root as STREAM");
            m_tree->set_root_as_stream();
        }
        m_state->node_id = m_tree->append_child(parent_id);
        m_tree->to_doc(m_state->node_id);
    }
    #ifdef RYML_NO_COVERAGE__TO_BE_DELETED
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_seq(parent_id) || m_tree->empty(parent_id));
        m_state->node_id = parent_id;
        if( ! m_tree->is_doc(parent_id))
        {
            m_tree->to_doc(parent_id, DOC);
        }
    }
    #endif
    _c4dbgpf("start_doc: id={}", m_state->node_id);
    add_flags(RUNK|RTOP|NDOC);
    _handle_types();
    rem_flags(NDOC);
}